

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

void start_struct_fn(File *fp,int size,char *type_str,char *name,char *whitespace)

{
  new_offset(fp,name);
  fp->first_member = 1;
  if (fp->binary != 0) {
    make_room_in_buf(&fp->tables,(ulong)(uint)size);
    return;
  }
  myfprintf(fp->fp,"%s %s = {%s",type_str,name,whitespace);
  return;
}

Assistant:

static void start_struct_fn(File *fp, int size, char *type_str, char *name, char *whitespace) {
  new_offset(fp, name);
  fp->first_member = 1;
  if (fp->binary) {
    make_room_in_buf(&fp->tables, size);
  } else {
    fprintf(fp->fp, "%s %s = {%s", type_str, name, whitespace);
  }
}